

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_rename(_glist *x,t_symbol *s,t_symbol *dir)

{
  _canvasenvironment *p_Var1;
  
  canvas_unbind(x);
  x->gl_name = s;
  canvas_bind(x);
  if (dir != &s_ && dir != (t_symbol *)0x0) {
    p_Var1 = canvas_getenv(x);
    p_Var1->ce_dir = dir;
  }
  if ((x->field_0xe8 & 1) == 0) {
    return;
  }
  canvas_reflecttitle(x);
  return;
}

Assistant:

void canvas_rename(t_canvas *x, t_symbol *s, t_symbol *dir)
{
    canvas_unbind(x);
    x->gl_name = s;
    canvas_bind(x);
    if (dir && dir != &s_)
    {
        t_canvasenvironment *e = canvas_getenv(x);
        e->ce_dir = dir;
    }
    if (x->gl_havewindow)
        canvas_reflecttitle(x);
}